

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::createAccessConstructorNode(Parser *this,Token *t)

{
  Node *this_00;
  
  this_00 = (Node *)operator_new(0x30);
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = t;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_ACCESS_CONSTRUCTOR;
  return this_00;
}

Assistant:

Node * createAccessConstructorNode(Token & t)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_CONSTRUCTOR;
    return n;
  }